

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_result_t * parasail_result_new_stats(void)

{
  parasail_result_t *ppVar1;
  void *pvVar2;
  
  ppVar1 = parasail_result_new();
  if (ppVar1 == (parasail_result_t *)0x0) {
    ppVar1 = (parasail_result_t *)0x0;
  }
  else {
    pvVar2 = malloc(0x18);
    (ppVar1->field_4).extra = pvVar2;
    if (pvVar2 == (void *)0x0) {
      ppVar1 = (parasail_result_t *)0x0;
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_stats",0x18);
    }
  }
  return ppVar1;
}

Assistant:

parasail_result_t* parasail_result_new_stats()
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    /* allocate only tables */
    PARASAIL_NEW(result->stats, parasail_result_extra_stats_t);

    return result;
}